

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.hpp
# Opt level: O0

Entry * array_new<Lib::Map<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>const*,Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>,Lib::DerefPtrHash<Lib::StlHash>>::Entry>
                  (void *placement,size_t length)

{
  long in_RSI;
  Entry *in_RDI;
  Entry *p;
  Entry *res;
  Entry *local_20;
  long local_10;
  
  local_20 = in_RDI;
  local_10 = in_RSI;
  while (local_10 != 0) {
    Lib::
    Map<const_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_*,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
    ::Entry::Entry(local_20);
    local_20 = local_20 + 1;
    local_10 = local_10 + -1;
  }
  return in_RDI;
}

Assistant:

T* array_new(void* placement, size_t length)
{
  ASS_NEQ(placement,0);
  ASS_G(length,0);

  T* res=static_cast<T*>(placement);
  T* p=res;
  while(length--) {
    ::new(static_cast<void*>(p++)) T();
  }
  return res;
}